

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_routines_hist.c
# Opt level: O2

int WebRtcIsac_DecHistOneStepMulti
              (int *data,Bitstr *streamdata,uint16_t **cdf,uint16_t *init_index,int N)

{
  uint8_t *puVar1;
  ushort *puVar2;
  ushort uVar3;
  ushort *puVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint8_t *puVar13;
  uint32_t uVar14;
  uint uVar15;
  
  uVar11 = streamdata->W_upper;
  if (uVar11 == 0) {
    iVar6 = -2;
  }
  else {
    puVar13 = streamdata->stream + streamdata->stream_index;
    if (streamdata->stream_index == 0) {
      uVar8 = *(uint *)puVar13;
      puVar13 = puVar13 + 3;
      uVar14 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
    }
    else {
      uVar14 = streamdata->streamval;
    }
    for (; 0 < N; N = N + -1) {
      uVar5 = uVar11 & 0xffff;
      uVar15 = uVar11 >> 0x10;
      puVar4 = *cdf;
      uVar3 = puVar4[*init_index];
      uVar8 = (uVar5 * uVar3 >> 0x10) + uVar15 * uVar3;
      uVar7 = (ulong)((uint)*init_index * 2);
      if (uVar8 < uVar14) {
        do {
          uVar10 = uVar8;
          if (uVar3 == 0xffff) {
            return -3;
          }
          uVar3 = *(ushort *)((long)puVar4 + uVar7 + 2);
          uVar9 = (uVar3 * uVar5 >> 0x10) + uVar15 * uVar3;
          uVar7 = uVar7 + 2;
          uVar8 = uVar9;
        } while (uVar9 < uVar14);
        iVar6 = (int)((long)uVar7 >> 1) + -1;
      }
      else {
        do {
          uVar9 = uVar8;
          puVar2 = (ushort *)((long)puVar4 + (uVar7 - 2));
          if (puVar2 < puVar4) {
            return -3;
          }
          uVar8 = (uint)*puVar2;
          uVar10 = (uVar8 * uVar5 >> 0x10) + uVar15 * uVar8;
          uVar7 = uVar7 - 2;
          uVar8 = uVar10;
        } while (uVar14 <= uVar10);
        iVar6 = (int)(uVar7 >> 1);
      }
      init_index = init_index + 1;
      *data = iVar6;
      data = data + 1;
      uVar14 = uVar14 - (uVar10 + 1);
      for (uVar11 = uVar9 - (uVar10 + 1); uVar11 < 0x1000000; uVar11 = uVar11 << 8) {
        puVar1 = puVar13 + 1;
        puVar13 = puVar13 + 1;
        uVar14 = uVar14 << 8 | (uint)*puVar1;
      }
      cdf = cdf + 1;
    }
    uVar12 = (int)puVar13 - (int)streamdata;
    streamdata->stream_index = uVar12;
    streamdata->W_upper = uVar11;
    streamdata->streamval = uVar14;
    if (uVar11 < 0x2000000) {
      iVar6 = uVar12 - 1;
    }
    else {
      iVar6 = uVar12 - 2;
    }
  }
  return iVar6;
}

Assistant:

int WebRtcIsac_DecHistOneStepMulti(int *data,        /* output: data vector */
                                   Bitstr *streamdata,      /* in-/output struct containing bitstream */
                                   const uint16_t **cdf,   /* input: array of cdf arrays */
                                   const uint16_t *init_index, /* input: vector of initial cdf table search entries */
                                   const int N)     /* input: data vector length */
{
  uint32_t    W_lower, W_upper;
  uint32_t    W_tmp;
  uint32_t    W_upper_LSB, W_upper_MSB;
  uint32_t    streamval;
  const   uint8_t *stream_ptr;
  const   uint16_t *cdf_ptr;
  int     k;


  stream_ptr = streamdata->stream + streamdata->stream_index;
  W_upper = streamdata->W_upper;
  if (W_upper == 0)
    /* Should not be possible in normal operation */
    return -2;

  if (streamdata->stream_index == 0)   /* first time decoder is called for this stream */
  {
    /* read first word from bytestream */
    streamval = *stream_ptr << 24;
    streamval |= *++stream_ptr << 16;
    streamval |= *++stream_ptr << 8;
    streamval |= *++stream_ptr;
  } else {
    streamval = streamdata->streamval;
  }


  for (k=N; k>0; k--)
  {
    /* find the integer *data for which streamval lies in [W_lower+1, W_upper] */
    W_upper_LSB = W_upper & 0x0000FFFF;
    W_upper_MSB = W_upper >> 16;

    /* start at the specified table entry */
    cdf_ptr = *cdf + (*init_index++);
    W_tmp = W_upper_MSB * *cdf_ptr;
    W_tmp += (W_upper_LSB * *cdf_ptr) >> 16;
    if (streamval > W_tmp)
    {
      for ( ;; )
      {
        W_lower = W_tmp;
        if (cdf_ptr[0]==65535)
          /* range check */
          return -3;
        W_tmp = W_upper_MSB * *++cdf_ptr;
        W_tmp += (W_upper_LSB * *cdf_ptr) >> 16;
        if (streamval <= W_tmp) break;
      }
      W_upper = W_tmp;
      *data++ = (int)(cdf_ptr - *cdf++ - 1);
    } else {
      for ( ;; )
      {
        W_upper = W_tmp;
        --cdf_ptr;
        if (cdf_ptr<*cdf) {
          /* range check */
          return -3;
        }
        W_tmp = W_upper_MSB * *cdf_ptr;
        W_tmp += (W_upper_LSB * *cdf_ptr) >> 16;
        if (streamval > W_tmp) break;
      }
      W_lower = W_tmp;
      *data++ = (int)(cdf_ptr - *cdf++);
    }

    /* shift interval to start at zero */
    W_upper -= ++W_lower;
    /* add integer to bitstream */
    streamval -= W_lower;

    /* renormalize interval and update streamval */
    while ( !(W_upper & 0xFF000000) )    /* W_upper < 2^24 */
    {
      /* read next byte from stream */
      streamval = (streamval << 8) | *++stream_ptr;
      W_upper <<= 8;
    }
  }

  streamdata->stream_index = (int)(stream_ptr - streamdata->stream);
  streamdata->W_upper = W_upper;
  streamdata->streamval = streamval;


  /* find number of bytes in original stream (determined by current interval width) */
  if ( W_upper > 0x01FFFFFF )
    return streamdata->stream_index - 2;
  else
    return streamdata->stream_index - 1;
}